

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster_test.c
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  MppNode node;
  
  node = test_node.node;
  _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test start\n",0);
  iVar2 = mpp_node_init(&node);
  if (iVar2 == 0) {
    _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test init node done\n",0);
    mpp_node_set_func(node,mpp_cluster_test_worker,&test_node);
    _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test attach node start\n",0);
    iVar2 = mpp_node_attach(node,9);
    if (iVar2 == 0) {
      bVar5 = false;
      _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test trigger start\n",0);
      uVar6 = 2;
      do {
        iVar2 = mpp_node_trigger_f("main",node,1);
        if (iVar2 != 0) {
          pcVar4 = "mpp_node_trigger failed ret %d\n";
          goto LAB_0010132f;
        }
        _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test trigger %d left\n",0,uVar6);
        usleep(5000);
        uVar6 = 1;
        bVar1 = !bVar5;
        bVar5 = true;
      } while (bVar1);
      _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test detach start\n",0);
      iVar2 = mpp_node_detach(node);
      if (iVar2 == 0) {
        iVar2 = 0;
        _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test deinit start\n",0);
        iVar3 = mpp_node_deinit(node);
        if (iVar3 == 0) {
          _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test deinit done\n",0);
          pcVar4 = "success";
        }
        else {
          _mpp_log_l(2,"mpp_cluster_test","mpp_node_deinit failed ret %d\n",0,iVar3);
          pcVar4 = "failed";
          iVar2 = iVar3;
        }
        goto LAB_00101345;
      }
      pcVar4 = "mpp_node_detach failed ret %d\n";
    }
    else {
      pcVar4 = "mpp_node_attach failed ret %d\n";
    }
  }
  else {
    pcVar4 = "mpp_node_init failed ret %d\n";
  }
LAB_0010132f:
  _mpp_log_l(2,"mpp_cluster_test",pcVar4,0,iVar2);
  pcVar4 = "failed";
LAB_00101345:
  _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test done %s\n",0,pcVar4);
  return iVar2;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppNode node = test_node.node;
    RK_U32 total_run = 2;

    mpp_log("mpp_cluster_test start\n");

    ret = mpp_node_init(&node);
    if (ret) {
        mpp_err("mpp_node_init failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test init node done\n");

    /* setup node info */
    mpp_node_set_func(node, mpp_cluster_test_worker, &test_node);

    mpp_log("mpp_cluster_test attach node start\n");
    ret = mpp_node_attach(node, VPU_CLIENT_RKVDEC);
    if (ret) {
        mpp_err("mpp_node_attach failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test trigger start\n");

    do {
        ret = mpp_node_trigger(node, 1);
        if (ret) {
            mpp_err("mpp_node_trigger failed ret %d\n", ret);
            goto DONE;
        }

        mpp_log("mpp_cluster_test trigger %d left\n", total_run);

        msleep(5);
    } while (--total_run);

    mpp_log("mpp_cluster_test detach start\n");

    ret = mpp_node_detach(node);
    if (ret) {
        mpp_err("mpp_node_detach failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test deinit start\n");

    ret = mpp_node_deinit(node);
    if (ret) {
        mpp_err("mpp_node_deinit failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test deinit done\n");

DONE:
    mpp_log("mpp_cluster_test done %s\n", ret ? "failed" : "success");
    return ret;
}